

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_1::BuiltinGlFragCoordXYZCaseInstance::setupDefaultInputs
          (BuiltinGlFragCoordXYZCaseInstance *this)

{
  undefined1 local_58 [8];
  float vertices [16];
  BuiltinGlFragCoordXYZCaseInstance *this_local;
  
  memcpy(local_58,&DAT_0130e600,0x40);
  ShaderRenderCaseInstance::addAttribute
            (&this->super_ShaderRenderCaseInstance,0,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,4,local_58);
  return;
}

Assistant:

void BuiltinGlFragCoordXYZCaseInstance::setupDefaultInputs (void)
{
	const float		vertices[]		=
	{
		-1.0f,  1.0f,  0.0f, 1.0f,
		-1.0f, -1.0f,  0.5f, 1.0f,
		 1.0f,  1.0f,  0.5f, 1.0f,
		 1.0f, -1.0f,  1.0f, 1.0f,
	};

	addAttribute(0u, VK_FORMAT_R32G32B32A32_SFLOAT, deUint32(sizeof(float) * 4), 4, vertices);
}